

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglversionprofile.cpp
# Opt level: O3

QDebug operator<<(QDebug debug,QOpenGLVersionProfile *vp)

{
  int *piVar1;
  long *in_RDX;
  QOpenGLVersionProfilePrivate *pQVar2;
  long in_FS_OFFSET;
  QByteArrayView QVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QDebugStateSaver saver;
  QDebug local_60;
  QDebug local_58;
  undefined1 *local_50;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_50,(QDebug *)vp);
  pQVar2 = vp->d;
  *(undefined1 *)&pQVar2[4].majorVersion = 0;
  QVar3.m_data = (storage_type *)0x16;
  QVar3.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar3);
  QTextStream::operator<<((QTextStream *)pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((char)vp->d[4].majorVersion == '\x01') {
    QTextStream::operator<<((QTextStream *)vp->d,' ');
  }
  piVar1 = (int *)*in_RDX;
  if (*piVar1 < 1) {
    pQVar2 = vp->d;
  }
  else {
    pQVar2 = vp->d;
    if (-1 < piVar1[1]) {
      QTextStream::operator<<((QTextStream *)pQVar2,*piVar1);
      pQVar2 = vp->d;
      if ((char)pQVar2[4].majorVersion == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar2,' ');
        pQVar2 = vp->d;
      }
      QTextStream::operator<<((QTextStream *)pQVar2,'.');
      pQVar2 = vp->d;
      if ((char)pQVar2[4].majorVersion == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar2,' ');
        pQVar2 = vp->d;
      }
      QTextStream::operator<<((QTextStream *)pQVar2,*(int *)(*in_RDX + 4));
      pQVar2 = vp->d;
      if ((char)pQVar2[4].majorVersion == '\x01') {
        QTextStream::operator<<((QTextStream *)pQVar2,' ');
        pQVar2 = vp->d;
      }
      QVar4.m_data = (storage_type *)0xa;
      QVar4.m_size = (qsizetype)&local_48;
      QString::fromUtf8(QVar4);
      QTextStream::operator<<((QTextStream *)pQVar2,&local_48);
      if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
        }
      }
      local_60.stream = (Stream *)vp->d;
      if ((char)((QOpenGLVersionProfilePrivate *)((long)local_60.stream + 0x30))->majorVersion ==
          '\x01') {
        QTextStream::operator<<((QTextStream *)local_60.stream,' ');
        local_60.stream = (Stream *)vp->d;
      }
      ((QOpenGLVersionProfilePrivate *)((long)local_60.stream + 0x24))->minorVersion =
           ((QOpenGLVersionProfilePrivate *)((long)local_60.stream + 0x24))->minorVersion + 1;
      qt_QMetaEnum_debugOperator
                (&local_58,(longlong)&local_60,(QMetaObject *)(ulong)*(uint *)(*in_RDX + 8),
                 (char *)&QSurfaceFormat::staticMetaObject);
      QDebug::~QDebug(&local_58);
      QDebug::~QDebug(&local_60);
      goto LAB_0016a3a8;
    }
  }
  QVar5.m_data = (storage_type *)0x7;
  QVar5.m_size = (qsizetype)&local_48;
  QString::fromUtf8(QVar5);
  QTextStream::operator<<((QTextStream *)pQVar2,&local_48);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((char)vp->d[4].majorVersion == '\x01') {
    QTextStream::operator<<((QTextStream *)vp->d,' ');
  }
LAB_0016a3a8:
  QTextStream::operator<<((QTextStream *)vp->d,')');
  pQVar2 = vp->d;
  if ((char)pQVar2[4].majorVersion == '\x01') {
    QTextStream::operator<<((QTextStream *)pQVar2,' ');
    pQVar2 = vp->d;
  }
  vp->d = (QOpenGLVersionProfilePrivate *)0x0;
  *(QOpenGLVersionProfilePrivate **)debug.stream = pQVar2;
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QOpenGLVersionProfile &vp)
{
    QDebugStateSaver saver(debug);
    debug.nospace();
    debug << "QOpenGLVersionProfile(";
    if (vp.isValid()) {
        debug << vp.version().first << '.' << vp.version().second
            << ", profile=" << vp.profile();
    } else {
        debug << "invalid";
    }
    debug << ')';
    return debug;
}